

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal-c.cpp
# Opt level: O1

bool duckdb::CastDecimalCInternal<duckdb_string>
               (duckdb_result *source,duckdb_string *result,idx_t col,idx_t row)

{
  PhysicalType PVar1;
  undefined4 uVar2;
  uint8_t width;
  uint8_t scale;
  pointer pQVar3;
  reference type;
  char *__dest;
  InternalException *this;
  ulong __n;
  char *__src;
  Vector *in_R9;
  int64_t *piVar4;
  hugeint_t input;
  Vector result_vec;
  undefined1 local_e0 [16];
  string local_d0;
  LogicalType local_b0;
  Vector local_98;
  
  pQVar3 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)source->internal_data);
  type = vector<duckdb::LogicalType,_true>::operator[](&(pQVar3->super_BaseQueryResult).types,col);
  width = DecimalType::GetWidth(type);
  scale = DecimalType::GetScale(type);
  LogicalType::LogicalType(&local_b0,VARCHAR);
  Vector::Vector(&local_98,&local_b0,false,false,0x800);
  LogicalType::~LogicalType(&local_b0);
  piVar4 = (int64_t *)(row * 0x10 + (long)source->deprecated_columns[col].deprecated_data);
  PVar1 = type->physical_type_;
  if (PVar1 < INT64) {
    if (PVar1 == INT16) {
      local_e0 = (undefined1  [16])
                 StringCastFromDecimal::Operation<short>((int16_t)*piVar4,width,scale,&local_98);
    }
    else {
      if (PVar1 != INT32) {
LAB_01815b9c:
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"Unimplemented internal type for decimal","");
        InternalException::InternalException(this,&local_d0);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_e0 = (undefined1  [16])
                 StringCastFromDecimal::Operation<int>((int32_t)*piVar4,width,scale,&local_98);
    }
  }
  else if (PVar1 == INT64) {
    local_e0 = (undefined1  [16])
               StringCastFromDecimal::Operation<long>(*piVar4,width,scale,&local_98);
  }
  else {
    if (PVar1 != INT128) goto LAB_01815b9c;
    input.upper._0_1_ = width;
    input.lower = piVar4[1];
    input.upper._1_7_ = 0;
    local_e0 = (undefined1  [16])
               StringCastFromDecimal::Operation<duckdb::hugeint_t>
                         ((StringCastFromDecimal *)*piVar4,input,scale,(uint8_t)&local_98,in_R9);
  }
  uVar2 = local_e0._0_4_;
  __n = (ulong)(uint)local_e0._0_4_;
  __dest = (char *)duckdb_malloc(__n + 1);
  result->data = __dest;
  if ((uint)uVar2 < 0xd) {
    __src = local_e0 + 4;
  }
  else {
    __src = (char *)local_e0._8_8_;
  }
  switchD_015ff80e::default(__dest,__src,__n);
  result->data[__n] = '\0';
  result->size = __n;
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return true;
}

Assistant:

bool CastDecimalCInternal(duckdb_result *source, duckdb_string &result, idx_t col, idx_t row) {
	auto result_data = (duckdb::DuckDBResultData *)source->internal_data;
	auto &query_result = result_data->result;
	auto &source_type = query_result->types[col];
	auto width = duckdb::DecimalType::GetWidth(source_type);
	auto scale = duckdb::DecimalType::GetScale(source_type);
	duckdb::Vector result_vec(duckdb::LogicalType::VARCHAR, false, false);
	duckdb::string_t result_string;
	void *source_address = UnsafeFetchPtr<hugeint_t>(source, col, row);
	switch (source_type.InternalType()) {
	case duckdb::PhysicalType::INT16:
		result_string = duckdb::StringCastFromDecimal::Operation<int16_t>(UnsafeFetchFromPtr<int16_t>(source_address),
		                                                                  width, scale, result_vec);
		break;
	case duckdb::PhysicalType::INT32:
		result_string = duckdb::StringCastFromDecimal::Operation<int32_t>(UnsafeFetchFromPtr<int32_t>(source_address),
		                                                                  width, scale, result_vec);
		break;
	case duckdb::PhysicalType::INT64:
		result_string = duckdb::StringCastFromDecimal::Operation<int64_t>(UnsafeFetchFromPtr<int64_t>(source_address),
		                                                                  width, scale, result_vec);
		break;
	case duckdb::PhysicalType::INT128:
		result_string = duckdb::StringCastFromDecimal::Operation<hugeint_t>(
		    UnsafeFetchFromPtr<hugeint_t>(source_address), width, scale, result_vec);
		break;
	default:
		throw duckdb::InternalException("Unimplemented internal type for decimal");
	}
	result.data = reinterpret_cast<char *>(duckdb_malloc(sizeof(char) * (result_string.GetSize() + 1)));
	memcpy(result.data, result_string.GetData(), result_string.GetSize());
	result.data[result_string.GetSize()] = '\0';
	result.size = result_string.GetSize();
	return true;
}